

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipm.cc
# Opt level: O1

void __thiscall ipx::IPM::StepSizes(IPM *this,Step *step,bool isCentring)

{
  int iVar1;
  uint uVar2;
  Iterate *pIVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  long lVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  undefined1 auVar19 [16];
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  
  pIVar3 = this->iterate_;
  lVar13 = -1;
  dVar17 = 1.0;
  dVar18 = 1.0;
  lVar12 = -1;
  uVar10 = (uint)(pIVar3->xl_)._M_size;
  if (0 < (int)uVar10) {
    uVar9 = 0xffffffff;
    uVar11 = 0;
    dVar18 = 1.0;
    do {
      dVar20 = (pIVar3->xl_)._M_data[uVar11];
      dVar16 = (step->xl)._M_data[uVar11];
      dVar21 = dVar18 * dVar16 + dVar20;
      uVar15 = -(ulong)(dVar21 < 0.0);
      if (dVar21 < 0.0) {
        uVar9 = uVar11 & 0xffffffff;
      }
      dVar18 = (double)(~uVar15 & (ulong)dVar18 |
                       (ulong)((dVar20 * -0.9999999999999998) / dVar16) & uVar15);
      uVar11 = uVar11 + 1;
    } while ((uVar10 & 0x7fffffff) != uVar11);
    lVar12 = (long)(int)uVar9;
  }
  dVar20 = 1.0;
  uVar10 = (uint)(pIVar3->xu_)._M_size;
  if (0 < (int)uVar10) {
    uVar9 = 0xffffffff;
    uVar11 = 0;
    dVar20 = 1.0;
    do {
      dVar16 = (pIVar3->xu_)._M_data[uVar11];
      dVar21 = (step->xu)._M_data[uVar11];
      dVar22 = dVar20 * dVar21 + dVar16;
      uVar15 = -(ulong)(dVar22 < 0.0);
      if (dVar22 < 0.0) {
        uVar9 = uVar11 & 0xffffffff;
      }
      dVar20 = (double)(~uVar15 & (ulong)dVar20 |
                       (ulong)((dVar16 * -0.9999999999999998) / dVar21) & uVar15);
      uVar11 = uVar11 + 1;
    } while ((uVar10 & 0x7fffffff) != uVar11);
    lVar13 = (long)(int)uVar9;
  }
  lVar14 = -1;
  dVar16 = 1.0;
  lVar8 = -1;
  uVar10 = (uint)(pIVar3->zl_)._M_size;
  if (0 < (int)uVar10) {
    uVar9 = 0xffffffff;
    uVar11 = 0;
    dVar16 = 1.0;
    do {
      dVar21 = (pIVar3->zl_)._M_data[uVar11];
      dVar22 = (step->zl)._M_data[uVar11];
      dVar23 = dVar16 * dVar22 + dVar21;
      uVar15 = -(ulong)(dVar23 < 0.0);
      if (dVar23 < 0.0) {
        uVar9 = uVar11 & 0xffffffff;
      }
      dVar16 = (double)(~uVar15 & (ulong)dVar16 |
                       (ulong)((dVar21 * -0.9999999999999998) / dVar22) & uVar15);
      uVar11 = uVar11 + 1;
    } while ((uVar10 & 0x7fffffff) != uVar11);
    lVar8 = (long)(int)uVar9;
  }
  iVar7 = pIVar3->model_->num_rows_;
  iVar1 = pIVar3->model_->num_cols_;
  uVar10 = (uint)(pIVar3->zu_)._M_size;
  if (0 < (int)uVar10) {
    uVar9 = 0xffffffff;
    uVar11 = 0;
    dVar17 = 1.0;
    do {
      dVar21 = (pIVar3->zu_)._M_data[uVar11];
      dVar22 = (step->zu)._M_data[uVar11];
      dVar23 = dVar17 * dVar22 + dVar21;
      uVar15 = -(ulong)(dVar23 < 0.0);
      if (dVar23 < 0.0) {
        uVar9 = uVar11 & 0xffffffff;
      }
      dVar17 = (double)(~uVar15 & (ulong)dVar17 |
                       (ulong)((dVar21 * -0.9999999999999998) / dVar22) & uVar15);
      uVar11 = uVar11 + 1;
    } while ((uVar10 & 0x7fffffff) != uVar11);
    lVar14 = (long)(int)uVar9;
  }
  dVar21 = dVar20;
  if (dVar18 <= dVar20) {
    dVar21 = dVar18;
  }
  dVar21 = (double)(~-(ulong)NAN(dVar18) & (ulong)dVar21 | -(ulong)NAN(dVar18) & (ulong)dVar20);
  uVar24 = SUB84(dVar17,0);
  uVar25 = (undefined4)((ulong)dVar17 >> 0x20);
  if (dVar16 <= dVar17) {
    uVar24 = SUB84(dVar16,0);
    uVar25 = (undefined4)((ulong)dVar16 >> 0x20);
  }
  dVar22 = (double)(~-(ulong)NAN(dVar16) & CONCAT44(uVar25,uVar24) |
                   -(ulong)NAN(dVar16) & (ulong)dVar17);
  uVar10 = iVar1 + iVar7;
  if (uVar10 == 0 || SCARRY4(iVar1,iVar7) != (int)uVar10 < 0) {
    dVar23 = NAN;
  }
  else {
    lVar6 = 0;
    dVar23 = 0.0;
    iVar7 = 0;
    do {
      uVar2 = *(uint *)((long)(pIVar3->variable_state_).
                              super__Vector_base<ipx::Iterate::StateDetail,_std::allocator<ipx::Iterate::StateDetail>_>
                              ._M_impl.super__Vector_impl_data._M_start + lVar6);
      if ((uVar2 & 0xfffffffd) == 0) {
        dVar23 = dVar23 + (*(double *)((long)(step->zl)._M_data + lVar6 * 2) * dVar22 +
                          *(double *)((long)(pIVar3->zl_)._M_data + lVar6 * 2)) *
                          (*(double *)((long)(step->xl)._M_data + lVar6 * 2) * dVar21 +
                          *(double *)((long)(pIVar3->xl_)._M_data + lVar6 * 2));
        iVar7 = iVar7 + 1;
      }
      if (uVar2 - 1 < 2) {
        dVar23 = dVar23 + (*(double *)((long)(step->zu)._M_data + lVar6 * 2) * dVar22 +
                          *(double *)((long)(pIVar3->zu_)._M_data + lVar6 * 2)) *
                          (*(double *)((long)(step->xu)._M_data + lVar6 * 2) * dVar21 +
                          *(double *)((long)(pIVar3->xu_)._M_data + lVar6 * 2));
        iVar7 = iVar7 + 1;
      }
      lVar6 = lVar6 + 4;
    } while ((ulong)uVar10 << 2 != lVar6);
    dVar23 = dVar23 / (double)iVar7;
  }
  uVar24 = 0;
  uVar25 = 0x3ff00000;
  if (dVar21 < 1.0) {
    bVar4 = dVar20 < dVar18;
    if (bVar4) {
      lVar12 = lVar13;
    }
    dVar20 = ((&pIVar3->xl_)[bVar4]._M_data[lVar12] -
             (dVar23 / 10.000000000000002) /
             ((&step->zl)[bVar4]._M_data[lVar12] * dVar22 + (&pIVar3->zl_)[bVar4]._M_data[lVar12]))
             / -(&step->xl)[bVar4]._M_data[lVar12];
    dVar18 = dVar21 * 0.9;
    if (dVar21 * 0.9 <= dVar20) {
      dVar18 = dVar20;
    }
    uVar24 = 0;
    uVar25 = 0x3ff00000;
    if (dVar18 <= 1.0) {
      uVar24 = SUB84(dVar18,0);
      uVar25 = (undefined4)((ulong)dVar18 >> 0x20);
    }
  }
  dVar18 = 1.0;
  if (dVar22 < 1.0) {
    bVar4 = dVar17 < dVar16;
    if (bVar4) {
      lVar8 = lVar14;
    }
    dVar18 = ((&pIVar3->zl_)[bVar4]._M_data[lVar8] -
             (dVar23 / 10.000000000000002) /
             ((&step->xl)[bVar4]._M_data[lVar8] * dVar21 + (&pIVar3->xl_)[bVar4]._M_data[lVar8])) /
             -(&step->zl)[bVar4]._M_data[lVar8];
    dVar17 = dVar22 * 0.9;
    if (dVar22 * 0.9 <= dVar18) {
      dVar17 = dVar18;
    }
    dVar18 = 1.0;
    if (dVar17 <= 1.0) {
      dVar18 = dVar17;
    }
  }
  auVar19._4_4_ = uVar25;
  auVar19._0_4_ = uVar24;
  auVar19._8_4_ = SUB84(dVar18,0);
  auVar19._12_4_ = (int)((ulong)dVar18 >> 0x20);
  auVar19 = minpd(_DAT_003e3330,auVar19);
  this->step_primal_ = (double)auVar19._0_8_;
  this->step_dual_ = (double)auVar19._8_8_;
  if (isCentring) {
    dVar17 = (this->control_->parameters_).super_ipx_parameters.centring_alpha_scaling;
    dVar20 = (double)CONCAT44(uVar25,uVar24) * dVar17;
    dVar18 = dVar18 * dVar17;
    auVar5._8_4_ = SUB84(dVar18,0);
    auVar5._0_8_ = dVar20;
    auVar5._12_4_ = (int)((ulong)dVar18 >> 0x20);
    this->step_primal_ = dVar20;
    this->step_dual_ = (double)auVar5._8_8_;
  }
  return;
}

Assistant:

void IPM::StepSizes(const Step& step, bool isCentring) {
    const Model& model = iterate_->model();
    const Int m = model.rows();
    const Int n = model.cols();
    const Vector& xl = iterate_->xl();
    const Vector& xu = iterate_->xu();
    const Vector& zl = iterate_->zl();
    const Vector& zu = iterate_->zu();
    const Vector& dxl = step.xl;
    const Vector& dxu = step.xu;
    const Vector& dzl = step.zl;
    const Vector& dzu = step.zu;
    const double gammaf = 0.9;
    const double gammaa = 1.0 / (1.0-gammaf);

    Int block_xl, block_xu, block_zl, block_zu;
    double step_xl = StepToBoundary(xl, dxl, &block_xl);
    double step_xu = StepToBoundary(xu, dxu, &block_xu);
    double step_zl = StepToBoundary(zl, dzl, &block_zl);
    double step_zu = StepToBoundary(zu, dzu, &block_zu);
    double maxp = std::fmin(step_xl, step_xu);
    double maxd = std::fmin(step_zl, step_zu);
    double mufull = 0.0;
    Int num_finite = 0;
    for (Int j = 0; j < n+m; j++) {
        if (iterate_->has_barrier_lb(j)) {
            assert(std::isfinite(xl[j]));
            assert(xl[j] != 0.0);
            mufull += (xl[j]+maxp*dxl[j]) * (zl[j]+maxd*dzl[j]);
            num_finite++;
        }
        if (iterate_->has_barrier_ub(j)) {
            assert(std::isfinite(xu[j]));
            assert(xu[j] != 0.0);
            mufull += (xu[j]+maxp*dxu[j]) * (zu[j]+maxd*dzu[j]);
            num_finite++;
        }
    }
    assert(std::isfinite(mufull));
    mufull /= num_finite;
    mufull /= gammaa;

    double alphap = 1.0;
    double alphad = 1.0;
    Int blockp = -1;
    Int blockd = -1;
    if (maxp < 1.0) {
        if (step_xl <= step_xu) {
            double buffer;
            blockp = block_xl;
            buffer = mufull / (zl[blockp] + maxd*dzl[blockp]);
            alphap = (xl[blockp]-buffer) / (-dxl[blockp]);
        } else {
            double buffer;
            blockp = block_xu;
            buffer = mufull / (zu[blockp] + maxd*dzu[blockp]);
            alphap = (xu[blockp]-buffer) / (-dxu[blockp]);
        }
        alphap = std::max(alphap, gammaf*maxp);
        alphap = std::min(alphap, 1.0);
        assert(blockp >= 0.0);
    }
    if (maxd < 1.0) {
        if (step_zl <= step_zu) {
            double buffer;
            blockd = block_zl;
            buffer = mufull / (xl[blockd] + maxp*dxl[blockd]);
            alphad = (zl[blockd]-buffer) / (-dzl[blockd]);
        } else {
            double buffer;
            blockd = block_zu;
            buffer = mufull / (xu[blockd] + maxp*dxu[blockd]);
            alphad = (zu[blockd]-buffer) / (-dzu[blockd]);
        }
        alphad = std::max(alphad, gammaf*maxd);
        alphad = std::min(alphad, 1.0);
        assert(blockd >= 0.0);
    }
    step_primal_ = std::min(alphap, 1.0-1e-6);
    step_dual_   = std::min(alphad, 1.0-1e-6);

    if (isCentring){
        // When computing stepsizes for a centring step, reduce them
        // by centringAlphaScaling. This ensures that the point is 
        // well centred and does not get too close to the boundary.
        step_primal_ = alphap * control_.centringAlphaScaling();
        step_dual_ = alphad * control_.centringAlphaScaling();
    }
}